

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1Unpin(sqlite3_pcache *p,sqlite3_pcache_page *pPg,int reuseUnlikely)

{
  long lVar1;
  void *pvVar2;
  PgHdr1 *pPage;
  PCache1 *pCache;
  
  if ((reuseUnlikely == 0) && (lVar1 = *(long *)p, *(uint *)(lVar1 + 0x14) <= *(uint *)(lVar1 + 8)))
  {
    pPg[3].pBuf = (void *)(lVar1 + 0x18);
    pvVar2 = *(void **)(lVar1 + 0x40);
    pPg[2].pExtra = pvVar2;
    *(sqlite3_pcache_page **)((long)pvVar2 + 0x30) = pPg;
    *(sqlite3_pcache_page **)(lVar1 + 0x40) = pPg;
    *(int *)(p + 0x34) = *(int *)(p + 0x34) + 1;
    return;
  }
  pcache1RemoveFromHash((PgHdr1 *)pPg,1);
  return;
}

Assistant:

static void pcache1Unpin(
  sqlite3_pcache *p, 
  sqlite3_pcache_page *pPg, 
  int reuseUnlikely
){
  PCache1 *pCache = (PCache1 *)p;
  PgHdr1 *pPage = (PgHdr1 *)pPg;
  PGroup *pGroup = pCache->pGroup;
 
  assert( pPage->pCache==pCache );
  pcache1EnterMutex(pGroup);

  /* It is an error to call this function if the page is already 
  ** part of the PGroup LRU list.
  */
  assert( pPage->pLruNext==0 );
  assert( PAGE_IS_PINNED(pPage) );

  if( reuseUnlikely || pGroup->nPurgeable>pGroup->nMaxPage ){
    pcache1RemoveFromHash(pPage, 1);
  }else{
    /* Add the page to the PGroup LRU list. */
    PgHdr1 **ppFirst = &pGroup->lru.pLruNext;
    pPage->pLruPrev = &pGroup->lru;
    (pPage->pLruNext = *ppFirst)->pLruPrev = pPage;
    *ppFirst = pPage;
    pCache->nRecyclable++;
  }

  pcache1LeaveMutex(pCache->pGroup);
}